

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  float *pfVar1;
  Float FVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  long lVar7;
  size_t in_RCX;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  span<const_pbrt::Point3<float>_> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  float afStack_48 [2];
  array<pbrt::Point3<float>,_4> local_40;
  
  cp.n = in_RCX;
  cp.ptr = (Point3<float> *)0x4;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (&local_40,(pbrt *)this->common->cpObj,cp,this->uMin,this->uMax);
  uVar6._0_4_ = this->uMin;
  uVar6._4_4_ = this->uMax;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar6;
  fVar9 = 0.0;
  FVar2 = this->common->width[0];
  fVar3 = this->common->width[1];
  lVar7 = 0x14;
  do {
    fVar4 = *(float *)((long)afStack_48 + lVar7 + 4);
    pfVar1 = (float *)((long)afStack_48 + lVar7);
    fVar5 = *(float *)((long)&local_40.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar7);
    lVar7 = lVar7 + 0xc;
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y =
         local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y - fVar4;
    auVar8 = ZEXT416((uint)(local_40.values[0].super_Tuple3<pbrt::Point3,_float>.x - *pfVar1));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y *
                                           local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y)),
                             auVar8,auVar8);
    auVar10 = ZEXT416((uint)(local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z - fVar5));
    auVar8 = vfmadd231ss_fma(auVar8,auVar10,auVar10);
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar9 = fVar9 + auVar8._0_4_;
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.x = *pfVar1;
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y = fVar4;
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar5;
  } while (lVar7 != 0x38);
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar8._4_4_ = FVar2;
  auVar8._0_4_ = FVar2;
  auVar8._8_4_ = FVar2;
  auVar8._12_4_ = FVar2;
  auVar10._0_4_ = fVar3 * (float)(undefined4)uVar6;
  auVar10._4_4_ = fVar3 * (float)uVar6._4_4_;
  auVar10._8_4_ = fVar3 * 0.0;
  auVar10._12_4_ = fVar3 * 0.0;
  auVar11 = vsubps_avx(auVar12,auVar11);
  auVar11 = vfmadd213ps_fma(auVar8,auVar11,auVar10);
  auVar11 = vhaddps_avx(auVar11,auVar11);
  return auVar11._0_4_ * 0.5 * fVar9;
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}